

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O1

void absl::lts_20240722::internal_statusor::Helper::HandleInvalidStatusCtorArg
               (Nonnull<absl::Status_*> status)

{
  char *absl_raw_log_internal_filename;
  char *kMessage;
  int local_20 [2];
  char *local_18;
  char *local_10;
  
  local_10 = "An OK status is not a valid constructor argument to StatusOr<T>";
  local_18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/status/statusor.cc"
  ;
  local_20[1] = 3;
  local_20[0] = 0x4f;
  base_internal::
  AtomicHook<void(*)(absl::lts_20240722::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20240722::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)&raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_20 + 1),
             &local_18,local_20,&local_10);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/status/statusor.cc"
                ,0x4f,
                "static void absl::internal_statusor::Helper::HandleInvalidStatusCtorArg(absl::Nonnull<absl::Status *>)"
               );
}

Assistant:

void Helper::HandleInvalidStatusCtorArg(absl::Nonnull<absl::Status*> status) {
  const char* kMessage =
      "An OK status is not a valid constructor argument to StatusOr<T>";
#ifdef NDEBUG
  ABSL_INTERNAL_LOG(ERROR, kMessage);
#else
  ABSL_INTERNAL_LOG(FATAL, kMessage);
#endif
  // In optimized builds, we will fall back to InternalError.
  *status = absl::InternalError(kMessage);
}